

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTestGenerator.cxx
# Opt level: O3

void __thiscall cmTestGenerator::GenerateOldStyle(cmTestGenerator *this,ostream *fout,Indent indent)

{
  char cVar1;
  cmTest *pcVar2;
  pointer pcVar3;
  size_type sVar4;
  ostream *poVar5;
  int iVar6;
  size_type sVar7;
  pointer pbVar8;
  pointer ppVar9;
  string exe;
  string *arg;
  string local_a8;
  int local_84;
  cmTestGenerator *local_80;
  string local_78;
  pointer local_58;
  pointer local_50;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_48;
  
  this->TestGenerated = true;
  pcVar2 = this->Test;
  pbVar8 = (pcVar2->Command).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  pcVar3 = (pbVar8->_M_dataplus)._M_p;
  local_84 = indent.Level;
  local_80 = this;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar3,pcVar3 + pbVar8->_M_string_length);
  cmsys::SystemTools::ConvertToUnixSlashes(&local_78);
  iVar6 = local_84;
  if (0 < local_84) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(fout," ",1);
      iVar6 = iVar6 + -1;
    } while (iVar6 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(fout,"add_test(",9);
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  pcVar3 = (local_80->Test->Name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a8,pcVar3,pcVar3 + (local_80->Test->Name)._M_string_length);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (fout,local_a8._M_dataplus._M_p,local_a8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," \"",2);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_78._M_dataplus._M_p,local_78._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  local_58 = (pcVar2->Command).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  pbVar8 = (pcVar2->Command).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  while (pbVar8 + 1 != local_58) {
    local_50 = pbVar8 + 1;
    std::__ostream_insert<char,std::char_traits<char>>(fout," \"",2);
    sVar4 = pbVar8[1]._M_string_length;
    if (sVar4 != 0) {
      pcVar3 = pbVar8[1]._M_dataplus._M_p;
      sVar7 = 0;
      do {
        cVar1 = pcVar3[sVar7];
        if (cVar1 == '\"') {
          local_a8._M_dataplus._M_p._0_1_ = 0x5c;
          std::__ostream_insert<char,std::char_traits<char>>(fout,(char *)&local_a8,1);
        }
        local_a8._M_dataplus._M_p._0_1_ = cVar1;
        std::__ostream_insert<char,std::char_traits<char>>(fout,(char *)&local_a8,1);
        sVar7 = sVar7 + 1;
      } while (sVar4 != sVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>(fout,"\"",1);
    pbVar8 = local_50;
  }
  std::__ostream_insert<char,std::char_traits<char>>(fout,")",1);
  cVar1 = (char)fout;
  std::ios::widen((char)fout->_vptr_basic_ostream[-3] + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  iVar6 = local_84;
  if (0 < local_84) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(fout," ",1);
      iVar6 = iVar6 + -1;
    } while (iVar6 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(fout,"set_tests_properties(",0x15);
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  pcVar3 = (local_80->Test->Name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a8,pcVar3,pcVar3 + (local_80->Test->Name)._M_string_length);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (fout,local_a8._M_dataplus._M_p,local_a8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," PROPERTIES ",0xc);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  cmPropertyMap::GetList_abi_cxx11_(&local_48,&local_80->Test->Properties);
  for (ppVar9 = local_48.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppVar9 != local_48.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; ppVar9 = ppVar9 + 1) {
    std::__ostream_insert<char,std::char_traits<char>>(fout," ",1);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (fout,(ppVar9->first)._M_dataplus._M_p,(ppVar9->first)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    cmOutputConverter::EscapeForCMake(&local_a8,&ppVar9->second);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,local_a8._M_dataplus._M_p,local_a8._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_48);
  GenerateInternalProperties(local_80,fout);
  std::__ostream_insert<char,std::char_traits<char>>(fout,")",1);
  std::ios::widen((char)fout->_vptr_basic_ostream[-3] + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmTestGenerator::GenerateOldStyle(std::ostream& fout, Indent indent)
{
  this->TestGenerated = true;

  // Get the test command line to be executed.
  std::vector<std::string> const& command = this->Test->GetCommand();

  std::string exe = command[0];
  cmSystemTools::ConvertToUnixSlashes(exe);
  fout << indent;
  fout << "add_test(";
  fout << this->Test->GetName() << " \"" << exe << "\"";

  for (std::string const& arg : cmMakeRange(command).advance(1)) {
    // Just double-quote all arguments so they are re-parsed
    // correctly by the test system.
    fout << " \"";
    for (char c : arg) {
      // Escape quotes within arguments.  We should escape
      // backslashes too but we cannot because it makes the result
      // inconsistent with previous behavior of this command.
      if (c == '"') {
        fout << '\\';
      }
      fout << c;
    }
    fout << "\"";
  }
  fout << ")" << std::endl;

  // Output properties for the test.
  fout << indent << "set_tests_properties(" << this->Test->GetName()
       << " PROPERTIES ";
  for (auto const& i : this->Test->GetProperties().GetList()) {
    fout << " " << i.first << " "
         << cmOutputConverter::EscapeForCMake(i.second);
  }
  this->GenerateInternalProperties(fout);
  fout << ")" << std::endl;
}